

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O2

int64_t interpolation_filter_rd
                  (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
                  BUFFER_SET *orig_dst,int64_t *rd,RD_STATS *rd_stats_luma,RD_STATS *rd_stats,
                  int *switchable_rate,BUFFER_SET **dst_bufs,int filter_idx,int *switchable_ctx,
                  int skip_pred)

{
  uint8_t uVar1;
  int_interpfilters iVar2;
  int_interpfilters filters;
  MB_MODE_INFO *pMVar3;
  int iVar4;
  uint8_t *puVar5;
  undefined7 in_register_00000009;
  long lVar6;
  uint8_t *puVar7;
  int num_planes;
  int iVar8;
  long lVar9;
  undefined4 in_stack_0000002c;
  RD_STATS this_rd_stats;
  BLOCK_SIZE local_74;
  RD_STATS this_rd_stats_luma;
  
  uVar1 = ((cpi->common).seq_params)->monochrome;
  pMVar3 = *(x->e_mbd).mi;
  this_rd_stats_luma.rate = 0;
  this_rd_stats_luma.zero_rate = 0;
  this_rd_stats_luma.dist = 0;
  this_rd_stats_luma.rdcost = 0;
  this_rd_stats_luma.sse = 0;
  this_rd_stats_luma.skip_txfm = '\x01';
  this_rd_stats._0_8_ = *rd;
  this_rd_stats.dist = rd[1];
  this_rd_stats.rdcost = rd[2];
  this_rd_stats.sse = rd[3];
  this_rd_stats._32_8_ = rd[4];
  iVar2 = pMVar3->interp_filters;
  filters = filter_sets[(ulong)dst_bufs & 0xffffffff];
  pMVar3->interp_filters = filters;
  iVar4 = get_switchable_rate(x,filters,(int *)CONCAT44(in_stack_0000002c,filter_idx),
                              (uint)((cpi->common).seq_params)->enable_dual_filter);
  lVar9 = (long)iVar4;
  lVar6 = (long)x->rdmult;
  puVar5 = orig_dst->plane[0];
  if ((long)puVar5 < lVar6 * lVar9 + 0x100 >> 9) {
    pMVar3->interp_filters = iVar2;
  }
  else {
    num_planes = (uint)(uVar1 == '\0') * 2 + 1;
    iVar8 = 3;
    if ((cpi->interp_search_flags).default_interp_skip_flags != (int)switchable_ctx) {
      iVar8 = (int)switchable_ctx;
    }
    if (iVar8 == 3) {
      this_rd_stats.skip_txfm = rd_stats_luma->skip_txfm;
      this_rd_stats._33_7_ = *(undefined7 *)&rd_stats_luma->field_0x21;
      this_rd_stats.rate = rd_stats_luma->rate;
      this_rd_stats.zero_rate = rd_stats_luma->zero_rate;
      this_rd_stats.dist = rd_stats_luma->dist;
      this_rd_stats.rdcost = rd_stats_luma->rdcost;
      this_rd_stats.sse = rd_stats_luma->sse;
    }
    else {
      local_74 = (BLOCK_SIZE)tile_data;
      if (iVar8 != 1) {
        if (iVar8 != 0) {
          return 0;
        }
        interp_model_rd_eval
                  (x,cpi,local_74,(BUFFER_SET *)CONCAT71(in_register_00000009,bsize),0,0,
                   &this_rd_stats_luma,0);
        this_rd_stats._33_7_ = this_rd_stats_luma._33_7_;
        this_rd_stats.skip_txfm = this_rd_stats_luma.skip_txfm;
        this_rd_stats.rdcost = this_rd_stats_luma.rdcost;
        this_rd_stats.sse = this_rd_stats_luma.sse;
        this_rd_stats.rate = this_rd_stats_luma.rate;
        this_rd_stats.zero_rate = this_rd_stats_luma.zero_rate;
        this_rd_stats.dist = this_rd_stats_luma.dist;
      }
      for (iVar8 = 1; num_planes != iVar8; iVar8 = iVar8 + 1) {
        if ((long)orig_dst->plane[0] <=
            this_rd_stats.dist * 0x80 +
            ((long)x->rdmult * (this_rd_stats.rate + lVar9) + 0x100 >> 9)) {
          pMVar3->interp_filters = iVar2;
          return 0;
        }
        interp_model_rd_eval
                  (x,cpi,local_74,(BUFFER_SET *)CONCAT71(in_register_00000009,bsize),iVar8,iVar8,
                   &this_rd_stats,0);
      }
      lVar6 = (long)x->rdmult;
      puVar5 = orig_dst->plane[0];
    }
    puVar7 = (uint8_t *)
             (this_rd_stats.dist * 0x80 + ((this_rd_stats.rate + lVar9) * lVar6 + 0x100 >> 9));
    if ((long)puVar7 < (long)puVar5) {
      orig_dst->plane[0] = puVar7;
      rd_stats->rate = iVar4;
      if ((cpi->interp_search_flags).default_interp_skip_flags != (int)switchable_ctx) {
        if ((int)switchable_ctx == 1) {
          rd_stats_luma->skip_txfm = this_rd_stats.skip_txfm;
          *(undefined7 *)&rd_stats_luma->field_0x21 = this_rd_stats._33_7_;
          rd_stats_luma->rdcost = this_rd_stats.rdcost;
          rd_stats_luma->sse = this_rd_stats.sse;
          rd_stats_luma->rate = this_rd_stats.rate;
          rd_stats_luma->zero_rate = this_rd_stats.zero_rate;
          rd_stats_luma->dist = this_rd_stats.dist;
          *(byte *)&x->recalc_luma_mc_data = (byte)x->recalc_luma_mc_data ^ 1;
        }
        else if ((int)switchable_ctx == 0) {
          rd[4] = CONCAT71(this_rd_stats_luma._33_7_,this_rd_stats_luma.skip_txfm);
          rd[2] = this_rd_stats_luma.rdcost;
          rd[3] = this_rd_stats_luma.sse;
          *rd = this_rd_stats_luma._0_8_;
          rd[1] = this_rd_stats_luma.dist;
          rd_stats_luma->skip_txfm = this_rd_stats.skip_txfm;
          *(undefined7 *)&rd_stats_luma->field_0x21 = this_rd_stats._33_7_;
          rd_stats_luma->rdcost = this_rd_stats.rdcost;
          rd_stats_luma->sse = this_rd_stats.sse;
          rd_stats_luma->rate = this_rd_stats.rate;
          rd_stats_luma->zero_rate = this_rd_stats.zero_rate;
          rd_stats_luma->dist = this_rd_stats.dist;
          x->recalc_luma_mc_data = 0;
        }
        swap_dst_buf(&x->e_mbd,(BUFFER_SET **)switchable_rate,num_planes);
        return 1;
      }
      return 1;
    }
    pMVar3->interp_filters = iVar2;
  }
  return 0;
}

Assistant:

static inline int64_t interpolation_filter_rd(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int64_t *const rd,
    RD_STATS *rd_stats_luma, RD_STATS *rd_stats, int *const switchable_rate,
    const BUFFER_SET *dst_bufs[2], int filter_idx, const int switchable_ctx[2],
    const int skip_pred) {
  const AV1_COMMON *cm = &cpi->common;
  const InterpSearchFlags *interp_search_flags = &cpi->interp_search_flags;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  RD_STATS this_rd_stats_luma, this_rd_stats;

  // Initialize rd_stats structures to default values.
  av1_init_rd_stats(&this_rd_stats_luma);
  this_rd_stats = *rd_stats_luma;
  const int_interpfilters last_best = mbmi->interp_filters;
  mbmi->interp_filters = filter_sets[filter_idx];
  const int tmp_rs =
      get_switchable_rate(x, mbmi->interp_filters, switchable_ctx,
                          cm->seq_params->enable_dual_filter);

  int64_t min_rd = RDCOST(x->rdmult, tmp_rs, 0);
  if (min_rd > *rd) {
    mbmi->interp_filters = last_best;
    return 0;
  }

  (void)tile_data;

  assert(skip_pred != 2);
  assert((rd_stats_luma->rate >= 0) && (rd_stats->rate >= 0));
  assert((rd_stats_luma->dist >= 0) && (rd_stats->dist >= 0));
  assert((rd_stats_luma->sse >= 0) && (rd_stats->sse >= 0));
  assert((rd_stats_luma->skip_txfm == 0) || (rd_stats_luma->skip_txfm == 1));
  assert((rd_stats->skip_txfm == 0) || (rd_stats->skip_txfm == 1));
  assert((skip_pred >= 0) &&
         (skip_pred <= interp_search_flags->default_interp_skip_flags));

  // When skip_txfm pred is equal to default_interp_skip_flags,
  // skip both luma and chroma MC.
  // For mono-chrome images:
  // num_planes = 1 and cpi->default_interp_skip_flags = 1,
  // skip_pred = 1: skip both luma and chroma
  // skip_pred = 0: Evaluate luma and as num_planes=1,
  // skip chroma evaluation
  int tmp_skip_pred =
      (skip_pred == interp_search_flags->default_interp_skip_flags)
          ? INTERP_SKIP_LUMA_SKIP_CHROMA
          : skip_pred;

  switch (tmp_skip_pred) {
    case INTERP_EVAL_LUMA_EVAL_CHROMA:
      // skip_pred = 0: Evaluate both luma and chroma.
      // Luma MC
      interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_Y, AOM_PLANE_Y,
                           &this_rd_stats_luma, 0);
      this_rd_stats = this_rd_stats_luma;
#if CONFIG_COLLECT_RD_STATS == 3
      RD_STATS rd_stats_y;
      av1_pick_recursive_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize,
                                          INT64_MAX);
      PrintPredictionUnitStats(cpi, tile_data, x, &rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 3
      AOM_FALLTHROUGH_INTENDED;
    case INTERP_SKIP_LUMA_EVAL_CHROMA:
      // skip_pred = 1: skip luma evaluation (retain previous best luma stats)
      // and do chroma evaluation.
      for (int plane = 1; plane < num_planes; ++plane) {
        int64_t tmp_rd =
            RDCOST(x->rdmult, tmp_rs + this_rd_stats.rate, this_rd_stats.dist);
        if (tmp_rd >= *rd) {
          mbmi->interp_filters = last_best;
          return 0;
        }
        interp_model_rd_eval(x, cpi, bsize, orig_dst, plane, plane,
                             &this_rd_stats, 0);
      }
      break;
    case INTERP_SKIP_LUMA_SKIP_CHROMA:
      // both luma and chroma evaluation is skipped
      this_rd_stats = *rd_stats;
      break;
    case INTERP_EVAL_INVALID:
    default: assert(0); return 0;
  }
  int64_t tmp_rd =
      RDCOST(x->rdmult, tmp_rs + this_rd_stats.rate, this_rd_stats.dist);

  if (tmp_rd < *rd) {
    *rd = tmp_rd;
    *switchable_rate = tmp_rs;
    if (skip_pred != interp_search_flags->default_interp_skip_flags) {
      if (skip_pred == INTERP_EVAL_LUMA_EVAL_CHROMA) {
        // Overwrite the data as current filter is the best one
        *rd_stats_luma = this_rd_stats_luma;
        *rd_stats = this_rd_stats;
        // As luma MC data is computed, no need to recompute after the search
        x->recalc_luma_mc_data = 0;
      } else if (skip_pred == INTERP_SKIP_LUMA_EVAL_CHROMA) {
        // As luma MC data is not computed, update of luma data can be skipped
        *rd_stats = this_rd_stats;
        // As luma MC data is not recomputed and current filter is the best,
        // indicate the possibility of recomputing MC data
        // If current buffer contains valid MC data, toggle to indicate that
        // luma MC data needs to be recomputed
        x->recalc_luma_mc_data ^= 1;
      }
      swap_dst_buf(xd, dst_bufs, num_planes);
    }
    return 1;
  }
  mbmi->interp_filters = last_best;
  return 0;
}